

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O1

int testStorageReaderTestsRawData(void)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  unsigned_long size;
  unsigned_long size_1;
  uint uVar5;
  difference_type __d1;
  pointer pFVar6;
  pointer pFVar7;
  bool bVar8;
  Span<const_unsigned_char,_18446744073709551615UL> SVar9;
  initializer_list<unsigned_char> __l;
  initializer_list<MILBlob::Fp16> __l_00;
  initializer_list<unsigned_int> __l_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expectedValues;
  StorageReader reader;
  AutoDeleteTempFile tempfile;
  allocator_type local_99;
  vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> local_98;
  StorageReader local_80;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  AutoDeleteTempFile local_48;
  
  MILBlob::TestUtil::MakeStorageTempFileWith3Records();
  psVar3 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_48);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + psVar3->_M_string_length);
  MILBlob::Blob::StorageReader::StorageReader(&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  SVar9 = MILBlob::Blob::StorageReader::GetRawDataView(&local_80,0x40);
  if (SVar9.m_size.m_size.m_size == 5) {
    local_58 = CONCAT35(local_58._5_3_,0x700400002);
    __l._M_len = 5;
    __l._M_array = (iterator)&local_58;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,__l,&local_99);
    pFVar7 = local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_start == 5) {
      pFVar6 = (pointer)0x0;
      if (local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pFVar6 = local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar2 = bcmp(SVar9.m_ptr,pFVar6,5);
      bVar8 = iVar2 == 0;
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      if (pFVar7 != (pointer)0x0) {
        operator_delete(pFVar7,(long)local_98.
                                     super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar7);
      }
      SVar9 = MILBlob::Blob::StorageReader::GetRawDataView(&local_80,0xc0);
      if (SVar9.m_size.m_size.m_size == 8) {
        local_58 = 0x810c0fe000e;
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)&local_58;
        std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector
                  (&local_98,__l_00,(allocator_type *)&local_99);
        pFVar7 = local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_start == 8) {
          pFVar6 = (pointer)0x0;
          if (local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pFVar6 = local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          iVar2 = bcmp(SVar9.m_ptr,pFVar6,8);
          bVar8 = iVar2 == 0;
        }
        else {
          bVar8 = false;
        }
        if (bVar8) {
          if (pFVar7 != (pointer)0x0) {
            operator_delete(pFVar7,(long)local_98.
                                         super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pFVar7);
          }
          SVar9 = MILBlob::Blob::StorageReader::GetRawDataView(&local_80,0x140);
          if (SVar9.m_size.m_size.m_size == 0x10) {
            local_58 = 0xc0fee00700000;
            uStack_50 = 0x91fade0008face;
            __l_01._M_len = 4;
            __l_01._M_array = (iterator)&local_58;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,__l_01,
                       (allocator_type *)&local_99);
            if ((long)local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x10) {
              pFVar7 = (pointer)0x0;
              if (local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_finish !=
                  local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl
                  .super__Vector_impl_data._M_start) {
                pFVar7 = local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              }
              iVar2 = bcmp(SVar9.m_ptr,pFVar7,0x10);
              bVar8 = iVar2 == 0;
            }
            else {
              bVar8 = false;
            }
            if (bVar8 == false) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                         ,0x7a);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11b);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,
                         "std::equal(data.begin(), data.end(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)).end())"
                         ,0xa4);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4," was false, expected true.",0x1a);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
            }
            if (local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.
                              super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_98.
                                    super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.
                                    super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar5 = (uint)(bVar8 ^ 1);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                       ,0x7a);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x118);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"(data.Size()) == (size_t(16))",0x1d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4," was false, expected true.",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            uVar5 = 1;
            std::ostream::flush();
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                     ,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x113);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,
                     "std::equal(data.begin(), data.end(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).begin(), Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)).end())"
                     ,0xb0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if (local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.
                            super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar5 = 1;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                   ,0x7a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x110);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(data.Size()) == (size_t(8))",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        uVar5 = 1;
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                 ,0x7a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,
                 "std::equal(data.begin(), data.end(), Util::MakeSpan(expectedValues).begin(), Util::MakeSpan(expectedValues).end())"
                 ,0x72);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar5 = 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(data.Size()) == (size_t(5))",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    uVar5 = 1;
    std::ostream::flush();
  }
  MILBlob::Blob::StorageReader::~StorageReader(&local_80);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_48);
  return uVar5;
}

Assistant:

int testStorageReaderTestsRawData()
{
    auto tempfile = TestUtil::MakeStorageTempFileWith3Records();

    StorageReader reader(tempfile.GetFilename());

    {  // read uint8_t weights from metadata 1
        const auto data = reader.GetRawDataView(64);
        ML_ASSERT_EQ(data.Size(), size_t(5));

        std::vector<uint8_t> expectedValues = {0x02, 0x00, 0x40, 0x00, 0x07};
        ML_ASSERT_SPAN_EQ(data, Util::MakeSpan(expectedValues));
    }

    {  // read Fp16 weights from metadata 2
        auto data = reader.GetRawDataView(192);
        ML_ASSERT_EQ(data.Size(), size_t(8));

        std::vector<Fp16> expectedValues = {Fp16(0x000E), Fp16(0xC0FE), Fp16(0x0810), Fp16(0x0000)};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<const uint8_t>(Util::MakeSpan(expectedValues)));
    }

    {  // read float weights from metadata 3
        auto data = reader.GetRawDataView(320);
        ML_ASSERT_EQ(data.Size(), size_t(16));

        std::vector<uint32_t> expectedValues = {0x700000, 0xC0FEE, 0x8FACE, 0x91FADE};
        ML_ASSERT_SPAN_EQ(data, Util::SpanCast<uint8_t>(Util::MakeSpan(expectedValues)));
    }

    return 0;
}